

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O2

void TestCipherAPI(EVP_CIPHER *cipher,Operation op,bool padding,bool copy,bool in_place,
                  bool use_evp_cipher,size_t chunk_size,Span<const_unsigned_char> key,
                  Span<const_unsigned_char> iv,Span<const_unsigned_char> plaintext,
                  Span<const_unsigned_char> ciphertext,Span<const_unsigned_char> aad,
                  Span<const_unsigned_char> tag)

{
  pointer puVar1;
  undefined4 uVar2;
  Operation OVar3;
  bool bVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  Span<const_unsigned_char> *pSVar9;
  uint uVar10;
  pointer *__ptr;
  long lVar11;
  AssertHelper AVar12;
  AssertHelper *this;
  long *plVar13;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar14;
  undefined7 in_register_00000081;
  char *pcVar15;
  char *pcVar16;
  undefined7 in_register_00000089;
  long lVar17;
  size_t sVar18;
  AssertionResult gtest_ar__12;
  size_t todo;
  _Alloc_hider local_d0;
  AssertionResult gtest_ar;
  UniquePtr<EVP_CIPHER_CTX> ctx;
  int len_1;
  undefined4 uStack_9c;
  pointer local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  int len;
  AssertHelper local_70;
  uint local_68;
  undefined4 local_64;
  uint local_60;
  Operation local_5c;
  Span<const_unsigned_char> local_58;
  uint32_t local_48;
  undefined4 local_44;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  uchar *local_38;
  
  pcVar16 = (char *)CONCAT71(in_register_00000089,use_evp_cipher);
  local_64 = SUB84(pcVar16,0);
  local_44 = (undefined4)CONCAT71(in_register_00000081,in_place);
  uVar8 = EVP_CIPHER_flags((EVP_CIPHER *)cipher);
  local_68 = (uint)uVar8;
  pSVar9 = &ciphertext;
  if (op == kEncrypt) {
    pSVar9 = &plaintext;
  }
  local_58 = *pSVar9;
  pSVar9 = &plaintext;
  if (op == kEncrypt) {
    pSVar9 = &ciphertext;
  }
  local_38 = pSVar9->data_;
  local_40._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar9->size_;
  uVar5 = EVP_CIPHER_mode(cipher);
  ctx._M_t.super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<evp_cipher_ctx_st,_bssl::internal::Deleter,_true,_true>)EVP_CIPHER_CTX_new()
  ;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         (tuple<evp_cipher_ctx_st_*,_bssl::internal::Deleter>)
                         ctx._M_t.super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl !=
                         (_Head_base<0UL,_evp_cipher_ctx_st_*,_false>)0x0);
  if ((tuple<evp_cipher_ctx_st_*,_bssl::internal::Deleter>)
      ctx._M_t.super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_evp_cipher_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__12);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&result,(AssertionResult *)0x49a3a2,"false","true",
               pcVar16);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&todo,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x98,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&todo,(Message *)&gtest_ar__12);
LAB_0021a4c7:
    puVar14 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&todo);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar__12._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__12._0_8_ + 8))();
    }
  }
  else {
    pcVar16 = (char *)(ulong)(uint)(op == kEncrypt);
    local_5c = op;
    local_48 = uVar5;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    iVar6 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)
                              ctx._M_t.
                              super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>._M_t
                              .super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,
                              (EVP_CIPHER *)cipher,(ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0,
                              (uint)(op == kEncrypt));
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,iVar6 != 0);
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&gtest_ar__12);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&result,
                 (AssertionResult *)
                 "EVP_CipherInit_ex(ctx.get(), cipher, nullptr, nullptr, nullptr, encrypt ? 1 : 0)",
                 "false","true",pcVar16);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&todo,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x9b,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&todo,(Message *)&gtest_ar__12);
      goto LAB_0021a4c7;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    iVar6 = EVP_CIPHER_CTX_set_key_length
                      ((EVP_CIPHER_CTX *)
                       ctx._M_t.super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,(int)key.size_
                      );
    uVar5 = local_48;
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,iVar6 != 0);
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&gtest_ar__12);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&result,
                 (AssertionResult *)"EVP_CIPHER_CTX_set_key_length(ctx.get(), key.size())","false",
                 "true",pcVar16);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&todo,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x9c,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&todo,(Message *)&gtest_ar__12);
      goto LAB_0021a4c7;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    if (!padding) {
      iVar6 = EVP_CIPHER_CTX_set_padding
                        ((EVP_CIPHER_CTX *)
                         ctx._M_t.super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,0);
      result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(result.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,iVar6 != 0);
      if (iVar6 == 0) {
        testing::Message::Message((Message *)&gtest_ar__12);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&result,
                   (AssertionResult *)"EVP_CIPHER_CTX_set_padding(ctx.get(), 0)","false","true",
                   pcVar16);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&todo,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x9e,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&todo,(Message *)&gtest_ar__12);
        goto LAB_0021a4c7;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    }
    bVar4 = MaybeCopyCipherContext(copy,&ctx);
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (!bVar4) {
      testing::Message::Message((Message *)&gtest_ar__12);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&result,
                 (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",pcVar16);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&todo,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xa2,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&todo,(Message *)&gtest_ar__12);
      goto LAB_0021a4c7;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    pcVar16 = (char *)0xffffffffffffffff;
    iVar6 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)
                              ctx._M_t.
                              super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>._M_t
                              .super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,
                              (EVP_CIPHER *)0x0,(ENGINE *)0x0,key.data_,(uchar *)0x0,-1);
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,iVar6 != 0);
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&gtest_ar__12);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&result,
                 (AssertionResult *)
                 "EVP_CipherInit_ex(ctx.get(), nullptr, nullptr, key.data(), nullptr, -1)","false",
                 "true",pcVar16);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&todo,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xa5,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&todo,(Message *)&gtest_ar__12);
      goto LAB_0021a4c7;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    bVar4 = MaybeCopyCipherContext(copy,&ctx);
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (!bVar4) {
      testing::Message::Message((Message *)&gtest_ar__12);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&result,
                 (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",pcVar16);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&todo,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xab,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&todo,(Message *)&gtest_ar__12);
      goto LAB_0021a4c7;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    if (uVar5 == 6) {
      result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)iv.size_;
      gtest_ar__12.success_ = true;
      gtest_ar__12._1_7_ = 0x7fffff;
      testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"iv.size()","size_t{2147483647}",(unsigned_long *)&result,
                 (unsigned_long *)&gtest_ar__12);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&result);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar16 = "";
        }
        else {
          pcVar16 = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__12,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xad,pcVar16);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__12,(Message *)&result)
        ;
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        iVar6 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)
                                    ctx._M_t.
                                    super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,
                                    9,(int)iv.size_,(void *)0x0);
        result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(result.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,iVar6 != 0);
        if (iVar6 == 0) {
          testing::Message::Message((Message *)&gtest_ar__12);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&result,
                     (AssertionResult *)
                     "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x9, static_cast<int>(iv.size()), nullptr)",
                     "false","true",pcVar16);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&todo,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0xaf,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&todo,(Message *)&gtest_ar__12)
          ;
          goto LAB_0021a4c7;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
        iVar6 = EVP_CIPHER_CTX_iv_length
                          ((EVP_CIPHER_CTX *)
                           ctx._M_t.
                           super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl);
        gtest_ar__12._0_4_ = iVar6;
        result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)iv.size_;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)&gtest_ar,"EVP_CIPHER_CTX_iv_length(ctx.get())","iv.size()",
                   (uint *)&gtest_ar__12,(unsigned_long *)&result);
        if (gtest_ar.success_ != false) goto LAB_0021a5bc;
        testing::Message::Message((Message *)&result);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar16 = "";
        }
        else {
          pcVar16 = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__12,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xb0,pcVar16);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__12,(Message *)&result)
        ;
      }
    }
    else {
      result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)iv.size_;
      gtest_ar__12._0_4_ =
           EVP_CIPHER_CTX_iv_length
                     ((EVP_CIPHER_CTX *)
                      ctx._M_t.super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>.
                      _M_t.super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&gtest_ar,"iv.size()","EVP_CIPHER_CTX_iv_length(ctx.get())",
                 (unsigned_long *)&result,(uint *)&gtest_ar__12);
      if (gtest_ar.success_ != false) {
LAB_0021a5bc:
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        pcVar16 = (char *)0xffffffffffffffff;
        iVar6 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)
                                  ctx._M_t.
                                  super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,
                                  (EVP_CIPHER *)0x0,(ENGINE *)0x0,(uchar *)0x0,iv.data_,-1);
        result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(result.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,iVar6 != 0);
        if (iVar6 == 0) {
          testing::Message::Message((Message *)&gtest_ar__12);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&result,
                     (AssertionResult *)
                     "EVP_CipherInit_ex(ctx.get(), nullptr, nullptr, nullptr, iv.data(), -1)",
                     "false","true",pcVar16);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&todo,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0xb6,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)&todo,(Message *)&gtest_ar__12)
          ;
          goto LAB_0021a4c7;
        }
        local_60 = (uint)copy;
        bVar4 = local_5c != kEncrypt;
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
        uVar2 = local_64;
        uVar10 = local_68;
        if (bVar4 && uVar5 == 6) {
          iVar6 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)
                                      ctx._M_t.
                                      super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>.
                                      _M_head_impl,0x11,(int)tag.size_,tag.data_);
          result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT71(result.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,iVar6 != 0);
          if (iVar6 == 0) {
            testing::Message::Message((Message *)&gtest_ar__12);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&result,
                       (AssertionResult *)
                       "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x11, tag.size(), const_cast<uint8_t *>(tag.data()))"
                       ,"false","true",pcVar16);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&todo,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0xbb,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&todo,(Message *)&gtest_ar__12);
            goto LAB_0021a4c7;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        }
        uVar10 = uVar10 >> 10;
        local_68 = CONCAT31(local_68._1_3_,(char)uVar10) & 0xffffff01;
        while (aad.size_ != 0) {
          uVar8 = chunk_size;
          if (aad.size_ < chunk_size) {
            uVar8 = aad.size_;
          }
          if (chunk_size == 0) {
            uVar8 = aad.size_;
          }
          uVar7 = (uint)uVar8;
          if ((char)uVar2 == '\0') {
            iVar6 = EVP_CipherUpdate((EVP_CIPHER_CTX *)
                                     ctx._M_t.
                                     super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl
                                     ,(uchar *)0x0,&len_1,aad.data_,uVar7);
            result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(result.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,iVar6 != 0);
            if (iVar6 == 0) {
              testing::Message::Message((Message *)&gtest_ar__12);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&result,
                         (AssertionResult *)
                         "EVP_CipherUpdate(ctx.get(), nullptr, &len, aad.data(), todo)","false",
                         "true",pcVar16);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&todo,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xcc,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&todo,(Message *)&gtest_ar__12);
              goto LAB_0021ab08;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&result.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
            result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(result.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar7);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"len","static_cast<int>(todo)",&len_1,(int *)&result);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&result);
              pcVar15 = "";
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar15 = *(char **)gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__12,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xcf,pcVar15);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__12,(Message *)&result);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
              if (result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)(*(long *)result.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 8))();
              }
            }
          }
          else {
            result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(result.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   (undefined1)local_68);
            result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            if ((uVar10 & 1) == 0) {
              testing::Message::Message((Message *)&gtest_ar__12);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&result,
                         (AssertionResult *)"is_custom_cipher","false","true",pcVar16);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&todo,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,199,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&todo,(Message *)&gtest_ar__12);
LAB_0021ab08:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&todo);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if (gtest_ar__12._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar__12._0_8_ + 8))();
              }
              puVar14 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              goto LAB_0021a4ed;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&result.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
            result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(result.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar7);
            iVar6 = EVP_Cipher((EVP_CIPHER_CTX *)
                               ctx._M_t.
                               super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>.
                               _M_t.
                               super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,
                               (uchar *)0x0,aad.data_,uVar7);
            gtest_ar__12._0_4_ = iVar6;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"static_cast<int>(todo)",
                       "EVP_Cipher(ctx.get(), nullptr, aad.data(), todo)",(int *)&result,
                       (int *)&gtest_ar__12);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&result);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar16 = "";
              }
              else {
                pcVar16 = *(char **)gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__12,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xc9,pcVar16);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__12,(Message *)&result);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
              if (result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)(*(long *)result.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 8))();
              }
              puVar14 = &gtest_ar.message_;
              goto LAB_0021a4ed;
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          aad = bssl::Span<const_unsigned_char>::subspan(&aad,uVar8,0xffffffffffffffff);
        }
        sVar18 = local_58.size_;
        uVar7 = EVP_CIPHER_CTX_block_size
                          ((EVP_CIPHER_CTX *)
                           ctx._M_t.
                           super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl);
        if (((1 < uVar7) &&
            (uVar8 = EVP_CIPHER_CTX_flags
                               ((EVP_CIPHER_CTX *)
                                ctx._M_t.
                                super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>
                                .super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl),
            ((uint)uVar8 >> 0xb & 1) == 0)) &&
           (iVar6 = EVP_CIPHER_CTX_encrypting
                              ((EVP_CIPHER_CTX *)
                               ctx._M_t.
                               super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>.
                               _M_t.
                               super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl),
           iVar6 != 0)) {
          sVar18 = (sVar18 + uVar7) - sVar18 % (ulong)uVar7;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&result,sVar18,(allocator_type *)&gtest_ar);
        uVar7 = local_60;
        sVar18 = local_58.size_;
        if ((char)local_44 != '\0') {
          if (local_58.size_ == 0) {
            sVar18 = 0;
          }
          else {
            memmove(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start,local_58.data_,local_58.size_);
            sVar18 = local_58.size_;
          }
          gtest_ar._0_8_ =
               result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )((long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
          local_58 = (Span<const_unsigned_char>)
                     bssl::Span<unsigned_char>::first((Span<unsigned_char> *)&gtest_ar,sVar18);
          sVar18 = local_58.size_;
        }
        lVar17 = 0;
        while (sVar18 != 0) {
          todo = chunk_size;
          if (sVar18 < chunk_size) {
            todo = sVar18;
          }
          if (chunk_size == 0) {
            todo = sVar18;
          }
          gtest_ar__12.success_ = true;
          gtest_ar__12._1_7_ = 0x7fffff;
          testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                    ((internal *)&gtest_ar,"todo","static_cast<size_t>(2147483647)",&todo,
                     (unsigned_long *)&gtest_ar__12);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__12);
            pcVar15 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar15 = *(char **)gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&len_1,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0xe6,pcVar15);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&len_1,(Message *)&gtest_ar__12);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len_1);
            if (gtest_ar__12._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__12._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          bVar4 = MaybeCopyCipherContext(SUB41(uVar7,0),&ctx);
          gtest_ar__12.success_ = bVar4;
          gtest_ar__12.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!bVar4) {
            testing::Message::Message((Message *)&len_1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__12,
                       (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",
                       pcVar16);
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0xe7,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&len_1);
LAB_0021aff5:
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if (_len_1 != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)_len_1 + 8))();
            }
            puVar14 = &gtest_ar__12.message_;
            goto LAB_0021b348;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__12.message_);
          if ((char)local_64 != '\0') {
            if ((uVar10 & 1) != 0) {
              len = EVP_Cipher((EVP_CIPHER_CTX *)
                               ctx._M_t.
                               super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>.
                               _M_t.
                               super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,
                               result.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar17,local_58.data_,
                               (uint)todo);
              goto LAB_0021ad90;
            }
            gtest_ar__12._0_4_ = 1;
            iVar6 = EVP_Cipher((EVP_CIPHER_CTX *)
                               ctx._M_t.
                               super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>.
                               _M_t.
                               super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,
                               result.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar17,local_58.data_,
                               (uint)todo);
            len_1 = iVar6;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"1",
                       "EVP_Cipher(ctx.get(), result.data() + total, in.data(), todo)",
                       (int *)&gtest_ar__12,&len_1);
            if (gtest_ar.success_ != false) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar.message_);
              len = (uint)todo;
              goto LAB_0021ad90;
            }
            testing::Message::Message((Message *)&gtest_ar__12);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar16 = "";
            }
            else {
              pcVar16 = *(char **)gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&len_1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0xef,pcVar16);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&len_1,(Message *)&gtest_ar__12);
LAB_0021b32a:
            this = (AssertHelper *)&len_1;
            goto LAB_0021b32f;
          }
          iVar6 = EVP_CipherUpdate((EVP_CIPHER_CTX *)
                                   ctx._M_t.
                                   super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,
                                   result.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar17,&len,
                                   local_58.data_,(uint)todo);
          gtest_ar__12.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__12.success_ = iVar6 != 0;
          if (iVar6 == 0) {
            testing::Message::Message((Message *)&len_1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__12,
                       (AssertionResult *)
                       "EVP_CipherUpdate(ctx.get(), result.data() + total, &len, in.data(), static_cast<int>(todo))"
                       ,"false","true",pcVar16);
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0xf4,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&len_1);
            goto LAB_0021aff5;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__12.message_);
LAB_0021ad90:
          gtest_ar__12._0_8_ = gtest_ar__12._0_8_ & 0xffffffff00000000;
          testing::internal::CmpHelperGE<int,int>
                    ((internal *)&gtest_ar,"len","0",&len,(int *)&gtest_ar__12);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__12);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar16 = "";
            }
            else {
              pcVar16 = *(char **)gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&len_1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0xf6,pcVar16);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&len_1,(Message *)&gtest_ar__12);
            goto LAB_0021b32a;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          lVar11 = (long)len;
          local_58 = bssl::Span<const_unsigned_char>::subspan(&local_58,todo,0xffffffffffffffff);
          lVar17 = lVar17 + lVar11;
          uVar7 = local_60;
          sVar18 = local_58.size_;
        }
        if (local_5c == kInvalidDecrypt) {
          if ((char)local_64 == '\0') {
            iVar6 = EVP_CipherFinal_ex((EVP_CIPHER_CTX *)
                                       ctx._M_t.
                                       super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>.
                                       _M_head_impl,
                                       result.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar17,&len);
            puVar14 = &gtest_ar__12.message_;
            gtest_ar__12.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__12.success_ = iVar6 == 0;
            if (iVar6 != 0) {
              testing::Message::Message((Message *)&todo);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar__12,
                         (AssertionResult *)
                         "EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len)","true","false"
                         ,pcVar16);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&len_1,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x103,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=((AssertHelper *)&len_1,(Message *)&todo);
              goto LAB_0021b2d4;
            }
          }
          else {
            gtest_ar__12.success_ = (bool)(undefined1)local_68;
            gtest_ar__12.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if ((uVar10 & 1) == 0) {
              testing::Message::Message((Message *)&todo);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar__12,
                         (AssertionResult *)"is_custom_cipher","false","true",pcVar16);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&len_1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xfe,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=((AssertHelper *)&len_1,(Message *)&todo);
LAB_0021b2d4:
              puVar14 = &gtest_ar__12.message_;
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len_1);
              std::__cxx11::string::~string((string *)&gtest_ar);
              AVar12.data_ = (AssertHelperData *)todo;
LAB_0021b2ed:
              if (AVar12.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)AVar12.data_ + 8))();
              }
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__12.message_);
              gtest_ar__12._0_4_ = 0xffffffff;
              iVar6 = EVP_Cipher((EVP_CIPHER_CTX *)
                                 ctx._M_t.
                                 super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,
                                 (uchar *)0x0,(uchar *)0x0,0);
              todo = CONCAT44(todo._4_4_,iVar6);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"-1","EVP_Cipher(ctx.get(), nullptr, nullptr, 0)",
                         (int *)&gtest_ar__12,(int *)&todo);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar__12);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar16 = "";
                }
                else {
                  pcVar16 = *(char **)gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&todo,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0xff,pcVar16);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&todo,(Message *)&gtest_ar__12);
                this = (AssertHelper *)&todo;
LAB_0021b32f:
                testing::internal::AssertHelper::~AssertHelper(this);
                plVar13 = (long *)gtest_ar__12._0_8_;
LAB_0021b338:
                if (plVar13 != (long *)0x0) {
                  (**(code **)(*plVar13 + 8))();
                }
              }
LAB_0021b343:
              puVar14 = &gtest_ar.message_;
            }
          }
LAB_0021b348:
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(puVar14);
        }
        else {
          if ((char)local_64 == '\0') {
            iVar6 = EVP_CipherFinal_ex((EVP_CIPHER_CTX *)
                                       ctx._M_t.
                                       super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>.
                                       _M_head_impl,
                                       result.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar17,&len);
            gtest_ar__12.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__12.success_ = iVar6 != 0;
            if (iVar6 == 0) {
              testing::Message::Message((Message *)&todo);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar__12,
                         (AssertionResult *)
                         "EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len)","false","true"
                         ,pcVar16);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&len_1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x10f,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=((AssertHelper *)&len_1,(Message *)&todo);
              goto LAB_0021b2d4;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__12.message_);
          }
          else if ((uVar10 & 1) == 0) {
            len = 0;
          }
          else {
            len = EVP_Cipher((EVP_CIPHER_CTX *)
                             ctx._M_t.
                             super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl,
                             (uchar *)0x0,(uchar *)0x0,0);
          }
          gtest_ar__12._0_8_ = gtest_ar__12._0_8_ & 0xffffffff00000000;
          testing::internal::CmpHelperGE<int,int>
                    ((internal *)&gtest_ar,"len","0",&len,(int *)&gtest_ar__12);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__12);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar16 = "";
            }
            else {
              pcVar16 = *(char **)gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&todo,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x111,pcVar16);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&todo,(Message *)&gtest_ar__12);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&todo);
            plVar13 = (long *)gtest_ar__12._0_8_;
LAB_0021b39c:
            puVar14 = &gtest_ar.message_;
            if (plVar13 != (long *)0x0) {
              (**(code **)(*plVar13 + 8))();
            }
            goto LAB_0021b348;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&result,lVar17 + len);
          gtest_ar__12._0_8_ = local_38;
          gtest_ar__12.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )local_40._M_head_impl;
          local_d0._M_p =
               (pointer)(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish +
                        -(long)result.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
          todo = (size_t)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)&gtest_ar,"Bytes(expected)","Bytes(result)",(Bytes *)&gtest_ar__12,
                     (Bytes *)&todo);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__12);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar15 = "";
            }
            else {
              pcVar15 = *(char **)gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&todo,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x114,pcVar15);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&todo,(Message *)&gtest_ar__12);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&todo);
            if (gtest_ar__12._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__12._0_8_ + 8))();
            }
          }
          uVar5 = local_48;
          OVar3 = local_5c;
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          if (OVar3 == kEncrypt && uVar5 == 6) {
            puVar1 = (pointer)tag.size_;
            _len_1 = (AssertHelperData *)&DAT_00000010;
            todo = (size_t)puVar1;
            testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                      ((internal *)&gtest_ar,"tag.size()","sizeof(rtag)",&todo,
                       (unsigned_long *)&len_1);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&todo);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar16 = "";
              }
              else {
                pcVar16 = *(char **)gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&len_1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x117,pcVar16);
              testing::internal::AssertHelper::operator=((AssertHelper *)&len_1,(Message *)&todo);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len_1);
              plVar13 = (long *)todo;
              goto LAB_0021b39c;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            bVar4 = MaybeCopyCipherContext(SUB41(local_60,0),&ctx);
            todo = CONCAT71(todo._1_7_,bVar4);
            local_d0._M_p = (pointer)0x0;
            if (bVar4) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_d0);
              iVar6 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)
                                          ctx._M_t.
                                          super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>.
                                          _M_head_impl,0x10,(int)tag.size_,&gtest_ar__12);
              local_d0._M_p = (pointer)0x0;
              todo = CONCAT71(todo._1_7_,iVar6 != 0);
              if (iVar6 != 0) {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_d0);
                todo = (size_t)tag.data_;
                local_d0._M_p = (pointer)puVar1;
                _len_1 = (AssertHelperData *)&gtest_ar__12;
                local_98 = puVar1;
                testing::internal::CmpHelperEQ<Bytes,Bytes>
                          ((internal *)&gtest_ar,"Bytes(tag)","Bytes(rtag, tag.size())",
                           (Bytes *)&todo,(Bytes *)&len_1);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&todo);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar16 = "";
                  }
                  else {
                    pcVar16 = *(char **)gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&len_1,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                             ,0x11b,pcVar16);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&len_1,(Message *)&todo);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&len_1);
                  plVar13 = (long *)todo;
                  goto LAB_0021b338;
                }
                goto LAB_0021b343;
              }
              testing::Message::Message((Message *)&len_1);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&todo,
                         (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x10, tag.size(), rtag)"
                         ,"false","true",pcVar16);
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x11a,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&len_1);
            }
            else {
              testing::Message::Message((Message *)&len_1);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&todo,
                         (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",
                         pcVar16);
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x118,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&len_1);
            }
            puVar14 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_d0;
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            std::__cxx11::string::~string((string *)&gtest_ar);
            AVar12.data_ = _len_1;
            goto LAB_0021b2ed;
          }
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        goto LAB_0021a4f2;
      }
      testing::Message::Message((Message *)&result);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar16 = "";
      }
      else {
        pcVar16 = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__12,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xb2,pcVar16);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__12,(Message *)&result);
    }
    puVar14 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12);
    if (result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
LAB_0021a4ed:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(puVar14);
LAB_0021a4f2:
  std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&ctx);
  return;
}

Assistant:

static void TestCipherAPI(const EVP_CIPHER *cipher, Operation op, bool padding,
                          bool copy, bool in_place, bool use_evp_cipher,
                          size_t chunk_size, bssl::Span<const uint8_t> key,
                          bssl::Span<const uint8_t> iv,
                          bssl::Span<const uint8_t> plaintext,
                          bssl::Span<const uint8_t> ciphertext,
                          bssl::Span<const uint8_t> aad,
                          bssl::Span<const uint8_t> tag) {
  bool encrypt = op == Operation::kEncrypt;
  bool is_custom_cipher =
      EVP_CIPHER_flags(cipher) & EVP_CIPH_FLAG_CUSTOM_CIPHER;
  bssl::Span<const uint8_t> in = encrypt ? plaintext : ciphertext;
  bssl::Span<const uint8_t> expected = encrypt ? ciphertext : plaintext;
  bool is_aead = EVP_CIPHER_mode(cipher) == EVP_CIPH_GCM_MODE;

  // Some |EVP_CIPHER|s take a variable-length key, and need to first be
  // configured with the key length, which requires configuring the cipher.
  bssl::UniquePtr<EVP_CIPHER_CTX> ctx(EVP_CIPHER_CTX_new());
  ASSERT_TRUE(ctx);
  ASSERT_TRUE(EVP_CipherInit_ex(ctx.get(), cipher, /*engine=*/nullptr,
                                /*key=*/nullptr, /*iv=*/nullptr,
                                encrypt ? 1 : 0));
  ASSERT_TRUE(EVP_CIPHER_CTX_set_key_length(ctx.get(), key.size()));
  if (!padding) {
    ASSERT_TRUE(EVP_CIPHER_CTX_set_padding(ctx.get(), 0));
  }

  // Configure the key.
  ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
  ASSERT_TRUE(EVP_CipherInit_ex(ctx.get(), /*cipher=*/nullptr,
                                /*engine=*/nullptr, key.data(), /*iv=*/nullptr,
                                /*enc=*/-1));

  // Configure the IV to run the actual operation. Callers that wish to use a
  // key for multiple, potentially concurrent, operations will likely copy at
  // this point. The |EVP_CIPHER_CTX| API uses the same type to represent a
  // pre-computed key schedule and a streaming operation.
  ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
  if (is_aead) {
    ASSERT_LE(iv.size(), size_t{INT_MAX});
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IVLEN,
                                    static_cast<int>(iv.size()), nullptr));
    ASSERT_EQ(EVP_CIPHER_CTX_iv_length(ctx.get()), iv.size());
  } else {
    ASSERT_EQ(iv.size(), EVP_CIPHER_CTX_iv_length(ctx.get()));
  }
  ASSERT_TRUE(EVP_CipherInit_ex(ctx.get(), /*cipher=*/nullptr,
                                /*engine=*/nullptr,
                                /*key=*/nullptr, iv.data(), /*enc=*/-1));

  if (is_aead && !encrypt) {
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_TAG,
                                    tag.size(),
                                    const_cast<uint8_t *>(tag.data())));
  }

  // Note: the deprecated |EVP_CIPHER|-based AEAD API is sensitive to whether
  // parameters are NULL, so it is important to skip the |in| and |aad|
  // |EVP_CipherUpdate| calls when empty.
  while (!aad.empty()) {
    size_t todo =
        chunk_size == 0 ? aad.size() : std::min(aad.size(), chunk_size);
    if (use_evp_cipher) {
      // AEADs always use the "custom cipher" return value convention. Passing a
      // null output pointer triggers the AAD logic.
      ASSERT_TRUE(is_custom_cipher);
      ASSERT_EQ(static_cast<int>(todo),
                EVP_Cipher(ctx.get(), nullptr, aad.data(), todo));
    } else {
      int len;
      ASSERT_TRUE(EVP_CipherUpdate(ctx.get(), nullptr, &len, aad.data(), todo));
      // Although it doesn't output anything, |EVP_CipherUpdate| should claim to
      // output the input length.
      EXPECT_EQ(len, static_cast<int>(todo));
    }
    aad = aad.subspan(todo);
  }

  // Set up the output buffer.
  size_t max_out = in.size();
  size_t block_size = EVP_CIPHER_CTX_block_size(ctx.get());
  if (block_size > 1 &&
      (EVP_CIPHER_CTX_flags(ctx.get()) & EVP_CIPH_NO_PADDING) == 0 &&
      EVP_CIPHER_CTX_encrypting(ctx.get())) {
    max_out += block_size - (max_out % block_size);
  }
  std::vector<uint8_t> result(max_out);
  if (in_place) {
    std::copy(in.begin(), in.end(), result.begin());
    in = bssl::Span(result).first(in.size());
  }

  size_t total = 0;
  int len;
  while (!in.empty()) {
    size_t todo = chunk_size == 0 ? in.size() : std::min(in.size(), chunk_size);
    EXPECT_LE(todo, static_cast<size_t>(INT_MAX));
    ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
    if (use_evp_cipher) {
      // |EVP_Cipher| sometimes returns the number of bytes written, or -1 on
      // error, and sometimes 1 or 0, implicitly writing |in_len| bytes.
      if (is_custom_cipher) {
        len = EVP_Cipher(ctx.get(), result.data() + total, in.data(), todo);
      } else {
        ASSERT_EQ(
            1, EVP_Cipher(ctx.get(), result.data() + total, in.data(), todo));
        len = static_cast<int>(todo);
      }
    } else {
      ASSERT_TRUE(EVP_CipherUpdate(ctx.get(), result.data() + total, &len,
                                   in.data(), static_cast<int>(todo)));
    }
    ASSERT_GE(len, 0);
    total += static_cast<size_t>(len);
    in = in.subspan(todo);
  }
  if (op == Operation::kInvalidDecrypt) {
    if (use_evp_cipher) {
      // Only the "custom cipher" return value convention can report failures.
      // Passing all nulls should act like |EVP_CipherFinal_ex|.
      ASSERT_TRUE(is_custom_cipher);
      EXPECT_EQ(-1, EVP_Cipher(ctx.get(), nullptr, nullptr, 0));
    } else {
      // Invalid padding and invalid tags all appear as a failed
      // |EVP_CipherFinal_ex|.
      EXPECT_FALSE(EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len));
    }
  } else {
    if (use_evp_cipher) {
      if (is_custom_cipher) {
        // Only the "custom cipher" convention has an |EVP_CipherFinal_ex|
        // equivalent.
        len = EVP_Cipher(ctx.get(), nullptr, nullptr, 0);
      } else {
        len = 0;
      }
    } else {
      ASSERT_TRUE(EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len));
    }
    ASSERT_GE(len, 0);
    total += static_cast<size_t>(len);
    result.resize(total);
    EXPECT_EQ(Bytes(expected), Bytes(result));
    if (encrypt && is_aead) {
      uint8_t rtag[16];
      ASSERT_LE(tag.size(), sizeof(rtag));
      ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
      ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_GET_TAG,
                                      tag.size(), rtag));
      EXPECT_EQ(Bytes(tag), Bytes(rtag, tag.size()));
    }
  }
}